

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rfc5444_reader_dropcontext.c
# Opt level: O0

rfc5444_result cb_tlv_packet(rfc5444_reader_tlvblock_entry *tlv,rfc5444_reader_tlvblock_context *c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int ti;
  int oi;
  rfc5444_reader_tlvblock_context *c_local;
  rfc5444_reader_tlvblock_entry *tlv_local;
  
  iVar2 = c->consumer->order + -1;
  iVar3 = tlv->type - 1;
  printf("%s: packet tlv %d (order %d): %d\n","cb_tlv_packet",(ulong)tlv->type,
         (ulong)(uint)c->consumer->order,(ulong)(uint)callback_index);
  iVar1 = callback_index + 1;
  idxcb_tlv_packet[iVar2][iVar3] = callback_index;
  callback_index = iVar1;
  return result_tlv_packet[iVar2][iVar3];
}

Assistant:

static enum rfc5444_result
cb_tlv_packet(struct rfc5444_reader_tlvblock_entry *tlv,
    struct rfc5444_reader_tlvblock_context *c) {
  int oi = c->consumer->order - 1;
  int ti = tlv->type - 1;

#ifdef PRINT_CB
  printf("%s: packet tlv %d (order %d): %d\n",
      __func__, tlv->type, c->consumer->order, callback_index);
#endif
  idxcb_tlv_packet[oi][ti] = callback_index++;
  return result_tlv_packet[oi][ti];
}